

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O2

cs_iterator
st_tree::detail::
node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
::_cs_iterator(node_type *n)

{
  int iVar1;
  cs_iterator j;
  node_type *pnVar2;
  _Base_ptr *pp_Var3;
  cs_iterator cVar4;
  missing_exception *pmVar5;
  parent_exception *this;
  _Base_ptr p_Var6;
  long lVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  allocator<char> local_31;
  string local_30;
  
  if ((n->
      super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
      )._parent == (node_type *)0x0) {
    this = (parent_exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"_cs_iterator(): node has no parent",&local_31);
    parent_exception::parent_exception(this,&local_30);
    __cxa_throw(this,&parent_exception::typeinfo,exception::~exception);
  }
  pnVar2 = node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
           ::parent(&n->
                     super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
                   );
  pp_Var3 = &(pnVar2->
             super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
             )._children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  iVar1 = (n->
          super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
          )._data.i1;
  p_Var9 = &(pnVar2->
            super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
            )._children._M_t._M_impl.super__Rb_tree_header._M_header;
  while( true ) {
    cVar4._M_node = *pp_Var3;
    if (cVar4._M_node == (_Base_ptr)0x0) goto LAB_00222412;
    lVar7 = 0x18;
    p_Var8 = p_Var9;
    if ((iVar1 <= *(int *)(*(long *)(cVar4._M_node + 1) + 0x20)) &&
       (lVar7 = 0x10, p_Var8 = cVar4._M_node, *(int *)(*(long *)(cVar4._M_node + 1) + 0x20) <= iVar1
       )) break;
    pp_Var3 = (_Base_ptr *)((long)&(cVar4._M_node)->_M_color + lVar7);
    p_Var9 = p_Var8;
  }
  p_Var6 = (cVar4._M_node)->_M_right;
  for (; p_Var8 = p_Var8->_M_left, p_Var8 != (_Base_ptr)0x0;
      p_Var8 = (_Base_ptr)
               (&p_Var8->_M_color + (ulong)(*(int *)(*(long *)(p_Var8 + 1) + 0x20) < iVar1) * 2)) {
    if (iVar1 <= *(int *)(*(long *)(p_Var8 + 1) + 0x20)) {
      cVar4._M_node = p_Var8;
    }
  }
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[*(int *)(*(long *)(p_Var6 + 1) + 0x20) <= iVar1]) {
    if (iVar1 < *(int *)(*(long *)(p_Var6 + 1) + 0x20)) {
      p_Var9 = p_Var6;
    }
  }
  if (cVar4._M_node != p_Var9) {
    while( true ) {
      if (cVar4._M_node == p_Var9) {
        pmVar5 = (missing_exception *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"_cs_iterator(): requested node does not exist",&local_31);
        missing_exception::missing_exception(pmVar5,&local_30);
        __cxa_throw(pmVar5,&missing_exception::typeinfo,exception::~exception);
      }
      if (*(node_type **)(cVar4._M_node + 1) == n) break;
      cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node);
    }
    return (cs_iterator)cVar4._M_node;
  }
LAB_00222412:
  pmVar5 = (missing_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"_cs_iterator(): requested node does not exist",&local_31);
  missing_exception::missing_exception(pmVar5,&local_30);
  __cxa_throw(pmVar5,&missing_exception::typeinfo,exception::~exception);
}

Assistant:

bool is_root() const { return NULL == _parent; }